

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Highs.cpp
# Opt level: O3

HighsStatus __thiscall Highs::passModelName(Highs *this,string *name)

{
  HighsStatus HVar1;
  
  if ((int)name->_M_string_length < 1) {
    highsLogUser(&(this->options_).super_HighsOptionsStruct.log_options,kError,
                 "Cannot define empty model names\n");
    HVar1 = kError;
  }
  else {
    std::__cxx11::string::_M_assign((string *)&(this->model_).lp_.model_name_);
    HVar1 = kOk;
  }
  return HVar1;
}

Assistant:

HighsStatus Highs::passModelName(const std::string& name) {
  if (int(name.length()) <= 0) {
    highsLogUser(options_.log_options, HighsLogType::kError,
                 "Cannot define empty model names\n");
    return HighsStatus::kError;
  }
  this->model_.lp_.model_name_ = name;
  return HighsStatus::kOk;
}